

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QCheckPoint>::emplace<QCheckPoint_const&>
          (QPodArrayOps<QCheckPoint> *this,qsizetype i,QCheckPoint *args)

{
  QCheckPoint **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  QCheckPoint *pQVar5;
  QFixed QVar6;
  int iVar7;
  QFixed QVar8;
  QFixed QVar9;
  QFixed QVar10;
  QFixed QVar11;
  qsizetype qVar12;
  QCheckPoint *pQVar13;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QCheckPoint>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<QCheckPoint>).size == i) &&
       (qVar12 = QArrayDataPointer<QCheckPoint>::freeSpaceAtEnd
                           (&this->super_QArrayDataPointer<QCheckPoint>), qVar12 != 0)) {
      lVar4 = (this->super_QArrayDataPointer<QCheckPoint>).size;
      pQVar13 = (this->super_QArrayDataPointer<QCheckPoint>).ptr;
      QVar6.val = (args->contentsWidth).val;
      pQVar5 = pQVar13 + lVar4;
      pQVar5->maximumWidth = (QFixed)(args->maximumWidth).val;
      pQVar5->contentsWidth = (QFixed)QVar6.val;
      QVar6.val = (args->frameY).val;
      iVar7 = args->positionInFrame;
      QVar8.val = (args->minimumWidth).val;
      pQVar13 = pQVar13 + lVar4;
      pQVar13->y = (QFixed)(args->y).val;
      pQVar13->frameY = (QFixed)QVar6.val;
      pQVar13->positionInFrame = iVar7;
      pQVar13->minimumWidth = (QFixed)QVar8.val;
    }
    else {
      if ((i != 0) ||
         (qVar12 = QArrayDataPointer<QCheckPoint>::freeSpaceAtBegin
                             (&this->super_QArrayDataPointer<QCheckPoint>), qVar12 == 0))
      goto LAB_0047ed81;
      pQVar13 = (this->super_QArrayDataPointer<QCheckPoint>).ptr;
      QVar6.val = (args->contentsWidth).val;
      pQVar13[-1].maximumWidth = (QFixed)(args->maximumWidth).val;
      pQVar13[-1].contentsWidth = (QFixed)QVar6.val;
      QVar6.val = (args->frameY).val;
      iVar7 = args->positionInFrame;
      QVar8.val = (args->minimumWidth).val;
      pQVar13[-1].y = (QFixed)(args->y).val;
      pQVar13[-1].frameY = (QFixed)QVar6.val;
      pQVar13[-1].positionInFrame = iVar7;
      pQVar13[-1].minimumWidth = (QFixed)QVar8.val;
      ppQVar1 = &(this->super_QArrayDataPointer<QCheckPoint>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QCheckPoint>).size;
    *pqVar2 = *pqVar2 + 1;
    return;
  }
LAB_0047ed81:
  QVar6.val = (args->y).val;
  QVar8.val = (args->frameY).val;
  iVar7 = args->positionInFrame;
  QVar9.val = (args->minimumWidth).val;
  QVar10.val = (args->maximumWidth).val;
  QVar11.val = (args->contentsWidth).val;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QCheckPoint>).size != 0);
  QArrayDataPointer<QCheckPoint>::detachAndGrow
            (&this->super_QArrayDataPointer<QCheckPoint>,where,1,(QCheckPoint **)0x0,
             (QArrayDataPointer<QCheckPoint> *)0x0);
  pQVar13 = createHole(this,where,i,1);
  pQVar13->y = (QFixed)QVar6.val;
  pQVar13->frameY = (QFixed)QVar8.val;
  pQVar13->positionInFrame = iVar7;
  pQVar13->minimumWidth = (QFixed)QVar9.val;
  pQVar13->maximumWidth = (QFixed)QVar10.val;
  pQVar13->contentsWidth = (QFixed)QVar11.val;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }